

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupDfsClasses(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  if (p->pReprsOld != (int *)0x0) {
    Gia_ManFillValue(p);
    iVar1 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar3;
    pGVar4 = Gia_ManConst0(p);
    pGVar4->Value = 0;
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar6 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCi(p,local_2c);
        bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pGStack_28->Value = uVar2;
      local_2c = local_2c + 1;
    }
    Gia_ManHashAlloc(p_00);
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar6 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCo(p,local_2c);
        bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      Gia_ManDupDfs_rec(p_00,p,pGStack_28);
      local_2c = local_2c + 1;
    }
    Gia_ManHashStop(p_00);
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,iVar1);
    pGVar5 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar5;
  }
  __assert_fail("p->pReprsOld != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x9d8,"Gia_Man_t *Gia_ManDupDfsClasses(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupDfsClasses( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprsOld != NULL );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupDfs_rec( pNew, p, pObj );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}